

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *in_RCX;
  int *in_RDX;
  ExprList *in_RSI;
  Parse *in_RDI;
  ExprList_item *pItem;
  ExprList *pEList;
  sqlite3 *db;
  int i;
  Expr *pError;
  int *piVar1;
  sqlite3 *zType_00;
  undefined4 in_stack_ffffffffffffffd0;
  int nSubquery;
  int local_4;
  
  zType_00 = in_RDI->db;
  if (((in_RDX == (int *)0x0) || (in_RDI->db->mallocFailed != '\0')) || (1 < in_RDI->eParseMode)) {
    local_4 = 0;
  }
  else if (zType_00->aLimit[2] < *in_RDX) {
    sqlite3ErrorMsg(in_RDI,"too many terms in %s BY clause",in_RCX);
    local_4 = 1;
  }
  else {
    piVar1 = *(int **)(in_RSI + 1);
    pError = (Expr *)(in_RDX + 2);
    for (nSubquery = 0; nSubquery < *in_RDX; nSubquery = nSubquery + 1) {
      if (*(short *)((long)&pError->pLeft + 4) != 0) {
        if (*piVar1 < (int)(uint)*(ushort *)((long)&pError->pLeft + 4)) {
          resolveOutOfRangeError
                    ((Parse *)CONCAT44(nSubquery,in_stack_ffffffffffffffd0),(char *)zType_00,
                     (int)((ulong)piVar1 >> 0x20),(int)piVar1,pError);
          return 1;
        }
        resolveAlias(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,nSubquery);
      }
      pError = (Expr *)&pError->pRight;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed || IN_RENAME_OBJECT ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr, 0);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,0);
    }
  }
  return 0;
}